

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits(Mvc_Cover_t *pCover)

{
  Mvc_Cover_t *pMVar1;
  Mvc_Cube_t *pCube;
  
  pMVar1 = Mvc_CoverDup(pCover);
  for (pCube = (pMVar1->lCubes).pHead; pCube != (Mvc_Cube_t *)0x0; pCube = pCube->pNext) {
    Mvc_CubeBitRemoveDcs(pCube);
  }
  return pMVar1;
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemoveDontCareLits( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCube;

    pCoverNew = Mvc_CoverDup( pCover );
    Mvc_CoverForEachCube( pCoverNew, pCube )
        Mvc_CubeBitRemoveDcs( pCube );
    return pCoverNew;
}